

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

CURLcode file_do(connectdata *conn,_Bool *done)

{
  Curl_easy *data_00;
  char *ptr;
  long lVar1;
  bool bVar2;
  __dev_t _Var3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  __off64_t _Var8;
  size_t len;
  bool bVar9;
  curltime cVar10;
  curltime now;
  size_t local_1d8;
  int local_1c4;
  size_t local_1a8;
  size_t bytestoread;
  ssize_t nread;
  char header [80];
  tm *tm;
  tm buffer;
  time_t filetime;
  FILEPROTO *file;
  long lStack_f0;
  int fd;
  curl_off_t bytecount;
  char *buf;
  Curl_easy *data;
  _Bool fstated;
  __dev_t _Stack_d0;
  _Bool size_known;
  curl_off_t expected_size;
  stat statbuf;
  CURLcode result;
  _Bool *done_local;
  connectdata *conn_local;
  
  statbuf.__glibc_reserved[2]._4_4_ = CURLE_OK;
  _Stack_d0 = 0;
  data_00 = conn->data;
  ptr = (data_00->state).buffer;
  lStack_f0 = 0;
  *done = true;
  Curl_pgrsStartNow(data_00);
  if ((*(ulong *)&(data_00->set).field_0x878 >> 0x1d & 1) == 0) {
    iVar6 = *(int *)((long)(conn->data->req).protop + 0x10);
    iVar5 = fstat64(iVar6,(stat64 *)&expected_size);
    _Var3 = statbuf.st_rdev;
    bVar9 = iVar5 != -1;
    if ((((!bVar9) ||
         ((data_00->info).filetime = statbuf.st_atim.tv_nsec, _Stack_d0 = _Var3,
         (data_00->state).range != (char *)0x0)) ||
        ((data_00->set).timecondition == CURL_TIMECOND_NONE)) ||
       (_Var4 = Curl_meets_timecondition(data_00,(data_00->info).filetime), _Var4)) {
      if (bVar9) {
        header._72_8_ = &tm;
        curl_msnprintf((char *)&nread,0x50,"Content-Length: %ld\r\n",_Stack_d0);
        statbuf.__glibc_reserved[2]._4_4_ = Curl_client_write(conn,2,(char *)&nread,0);
        if (statbuf.__glibc_reserved[2]._4_4_ != CURLE_OK) {
          return statbuf.__glibc_reserved[2]._4_4_;
        }
        statbuf.__glibc_reserved[2]._4_4_ = Curl_client_write(conn,2,"Accept-ranges: bytes\r\n",0);
        if (statbuf.__glibc_reserved[2]._4_4_ != CURLE_OK) {
          return statbuf.__glibc_reserved[2]._4_4_;
        }
        buffer.tm_zone = (char *)statbuf.st_atim.tv_nsec;
        statbuf.__glibc_reserved[2]._4_4_ = Curl_gmtime(statbuf.st_atim.tv_nsec,(tm *)&tm);
        if (statbuf.__glibc_reserved[2]._4_4_ != CURLE_OK) {
          return statbuf.__glibc_reserved[2]._4_4_;
        }
        if (*(int *)(header._72_8_ + 0x18) == 0) {
          local_1c4 = 6;
        }
        else {
          local_1c4 = *(int *)(header._72_8_ + 0x18) + -1;
        }
        pcVar7 = "\r\n";
        if ((*(ulong *)&(data_00->set).field_0x878 >> 0x1c & 1) != 0) {
          pcVar7 = "";
        }
        curl_msnprintf((char *)&nread,0x50,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n%s"
                       ,Curl_wkday[local_1c4],(ulong)*(uint *)(header._72_8_ + 0xc),
                       Curl_month[*(int *)(header._72_8_ + 0x10)],
                       *(int *)(header._72_8_ + 0x14) + 0x76c,*(undefined4 *)(header._72_8_ + 8),
                       *(undefined4 *)(header._72_8_ + 4),*(undefined4 *)header._72_8_,pcVar7);
        statbuf.__glibc_reserved[2]._4_4_ = Curl_client_write(conn,2,(char *)&nread,0);
        if (statbuf.__glibc_reserved[2]._4_4_ != CURLE_OK) {
          return statbuf.__glibc_reserved[2]._4_4_;
        }
        Curl_pgrsSetDownloadSize(data_00,_Stack_d0);
        if ((*(ulong *)&(data_00->set).field_0x878 >> 0x1c & 1) != 0) {
          return statbuf.__glibc_reserved[2]._4_4_;
        }
      }
      statbuf.__glibc_reserved[2]._4_4_ = Curl_range(conn);
      conn_local._4_4_ = statbuf.__glibc_reserved[2]._4_4_;
      if (statbuf.__glibc_reserved[2]._4_4_ == CURLE_OK) {
        if ((data_00->state).resume_from < 0) {
          if (!bVar9) {
            Curl_failf(data_00,"Can\'t get the size of file.");
            return CURLE_READ_ERROR;
          }
          (data_00->state).resume_from = statbuf.st_rdev + (data_00->state).resume_from;
        }
        if ((long)_Stack_d0 < (data_00->state).resume_from) {
          Curl_failf(data_00,"failed to resume file:// transfer");
          conn_local._4_4_ = CURLE_BAD_DOWNLOAD_RESUME;
        }
        else {
          _Stack_d0 = _Stack_d0 - (data_00->state).resume_from;
          if (0 < (data_00->req).maxdownload) {
            _Stack_d0 = (data_00->req).maxdownload;
          }
          if ((bVar9) && (_Stack_d0 != 0)) {
            bVar2 = true;
          }
          else {
            bVar2 = false;
          }
          if (bVar9) {
            Curl_pgrsSetDownloadSize(data_00,_Stack_d0);
          }
          if (((data_00->state).resume_from == 0) ||
             (lVar1 = (data_00->state).resume_from,
             _Var8 = lseek64(iVar6,(data_00->state).resume_from,0), lVar1 == _Var8)) {
            Curl_pgrsTime(data_00,TIMER_STARTTRANSFER);
            while (statbuf.__glibc_reserved[2]._4_4_ == CURLE_OK) {
              if (bVar2) {
                if ((long)_Stack_d0 < (data_00->set).buffer_size) {
                  local_1d8 = curlx_sotouz(_Stack_d0);
                }
                else {
                  local_1d8 = (data_00->set).buffer_size;
                }
                local_1a8 = local_1d8;
              }
              else {
                local_1a8 = (data_00->set).buffer_size - 1;
              }
              len = read(iVar6,ptr,local_1a8);
              if (((long)len < 1) || ((ptr[len] = '\0', bVar2 && (_Stack_d0 == 0)))) break;
              lStack_f0 = len + lStack_f0;
              if (bVar2) {
                _Stack_d0 = _Stack_d0 - len;
              }
              statbuf.__glibc_reserved[2]._4_4_ = Curl_client_write(conn,1,ptr,len);
              if (statbuf.__glibc_reserved[2]._4_4_ != CURLE_OK) {
                return statbuf.__glibc_reserved[2]._4_4_;
              }
              Curl_pgrsSetDownloadCounter(data_00,lStack_f0);
              iVar5 = Curl_pgrsUpdate(conn);
              if (iVar5 == 0) {
                cVar10 = Curl_now();
                now._12_4_ = 0;
                now.tv_sec = SUB128(cVar10._0_12_,0);
                now.tv_usec = SUB124(cVar10._0_12_,8);
                statbuf.__glibc_reserved[2]._4_4_ = Curl_speedcheck(data_00,now);
              }
              else {
                statbuf.__glibc_reserved[2]._4_4_ = CURLE_ABORTED_BY_CALLBACK;
              }
            }
            iVar6 = Curl_pgrsUpdate(conn);
            if (iVar6 != 0) {
              statbuf.__glibc_reserved[2]._4_4_ = CURLE_ABORTED_BY_CALLBACK;
            }
            conn_local._4_4_ = statbuf.__glibc_reserved[2]._4_4_;
          }
          else {
            conn_local._4_4_ = CURLE_BAD_DOWNLOAD_RESUME;
          }
        }
      }
    }
    else {
      *done = true;
      conn_local._4_4_ = CURLE_OK;
    }
  }
  else {
    conn_local._4_4_ = file_upload(conn);
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode file_do(struct connectdata *conn, bool *done)
{
  /* This implementation ignores the host name in conformance with
     RFC 1738. Only local files (reachable via the standard file system)
     are supported. This means that files on remotely mounted directories
     (via NFS, Samba, NT sharing) can be accessed through a file:// URL
  */
  CURLcode result = CURLE_OK;
  struct_stat statbuf; /* struct_stat instead of struct stat just to allow the
                          Windows version to have a different struct without
                          having to redefine the simple word 'stat' */
  curl_off_t expected_size = 0;
  bool size_known;
  bool fstated = FALSE;
  struct Curl_easy *data = conn->data;
  char *buf = data->state.buffer;
  curl_off_t bytecount = 0;
  int fd;
  struct FILEPROTO *file;

  *done = TRUE; /* unconditionally */

  Curl_pgrsStartNow(data);

  if(data->set.upload)
    return file_upload(conn);

  file = conn->data->req.protop;

  /* get the fd from the connection phase */
  fd = file->fd;

  /* VMS: This only works reliable for STREAMLF files */
  if(-1 != fstat(fd, &statbuf)) {
    /* we could stat it, then read out the size */
    expected_size = statbuf.st_size;
    /* and store the modification time */
    data->info.filetime = statbuf.st_mtime;
    fstated = TRUE;
  }

  if(fstated && !data->state.range && data->set.timecondition) {
    if(!Curl_meets_timecondition(data, data->info.filetime)) {
      *done = TRUE;
      return CURLE_OK;
    }
  }

  if(fstated) {
    time_t filetime;
    struct tm buffer;
    const struct tm *tm = &buffer;
    char header[80];
    msnprintf(header, sizeof(header),
              "Content-Length: %" CURL_FORMAT_CURL_OFF_T "\r\n",
              expected_size);
    result = Curl_client_write(conn, CLIENTWRITE_HEADER, header, 0);
    if(result)
      return result;

    result = Curl_client_write(conn, CLIENTWRITE_HEADER,
                               (char *)"Accept-ranges: bytes\r\n", 0);
    if(result)
      return result;

    filetime = (time_t)statbuf.st_mtime;
    result = Curl_gmtime(filetime, &buffer);
    if(result)
      return result;

    /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
    msnprintf(header, sizeof(header),
              "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n%s",
              Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
              tm->tm_mday,
              Curl_month[tm->tm_mon],
              tm->tm_year + 1900,
              tm->tm_hour,
              tm->tm_min,
              tm->tm_sec,
              data->set.opt_no_body ? "": "\r\n");
    result = Curl_client_write(conn, CLIENTWRITE_HEADER, header, 0);
    if(result)
      return result;
    /* set the file size to make it available post transfer */
    Curl_pgrsSetDownloadSize(data, expected_size);
    if(data->set.opt_no_body)
      return result;
  }

  /* Check whether file range has been specified */
  result = Curl_range(conn);
  if(result)
    return result;

  /* Adjust the start offset in case we want to get the N last bytes
   * of the stream if the filesize could be determined */
  if(data->state.resume_from < 0) {
    if(!fstated) {
      failf(data, "Can't get the size of file.");
      return CURLE_READ_ERROR;
    }
    data->state.resume_from += (curl_off_t)statbuf.st_size;
  }

  if(data->state.resume_from <= expected_size)
    expected_size -= data->state.resume_from;
  else {
    failf(data, "failed to resume file:// transfer");
    return CURLE_BAD_DOWNLOAD_RESUME;
  }

  /* A high water mark has been specified so we obey... */
  if(data->req.maxdownload > 0)
    expected_size = data->req.maxdownload;

  if(!fstated || (expected_size == 0))
    size_known = FALSE;
  else
    size_known = TRUE;

  /* The following is a shortcut implementation of file reading
     this is both more efficient than the former call to download() and
     it avoids problems with select() and recv() on file descriptors
     in Winsock */
  if(fstated)
    Curl_pgrsSetDownloadSize(data, expected_size);

  if(data->state.resume_from) {
    if(data->state.resume_from !=
       lseek(fd, data->state.resume_from, SEEK_SET))
      return CURLE_BAD_DOWNLOAD_RESUME;
  }

  Curl_pgrsTime(data, TIMER_STARTTRANSFER);

  while(!result) {
    ssize_t nread;
    /* Don't fill a whole buffer if we want less than all data */
    size_t bytestoread;

    if(size_known) {
      bytestoread = (expected_size < data->set.buffer_size) ?
        curlx_sotouz(expected_size) : (size_t)data->set.buffer_size;
    }
    else
      bytestoread = data->set.buffer_size-1;

    nread = read(fd, buf, bytestoread);

    if(nread > 0)
      buf[nread] = 0;

    if(nread <= 0 || (size_known && (expected_size == 0)))
      break;

    bytecount += nread;
    if(size_known)
      expected_size -= nread;

    result = Curl_client_write(conn, CLIENTWRITE_BODY, buf, nread);
    if(result)
      return result;

    Curl_pgrsSetDownloadCounter(data, bytecount);

    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, Curl_now());
  }
  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;

  return result;
}